

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tsqueue.h
# Opt level: O0

void __thiscall
blcl::net::tsqueue<blcl::net::owned_message<MsgType>_>::clear
          (tsqueue<blcl::net::owned_message<MsgType>_> *this)

{
  scoped_lock<std::mutex> local_18;
  scoped_lock<std::mutex> lock;
  tsqueue<blcl::net::owned_message<MsgType>_> *this_local;
  
  lock._M_device = (mutex_type *)this;
  std::scoped_lock<std::mutex>::scoped_lock(&local_18,&this->queue_mtx_);
  std::deque<blcl::net::owned_message<MsgType>,_std::allocator<blcl::net::owned_message<MsgType>_>_>
  ::clear(&this->raw_deque_);
  std::scoped_lock<std::mutex>::~scoped_lock(&local_18);
  return;
}

Assistant:

void clear() {
            std::scoped_lock lock(queue_mtx_);
            raw_deque_.clear();
        }